

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptReflect.cpp
# Opt level: O0

Var Js::JavascriptReflect::EntryDefineProperty(RecyclableObject *function,CallInfo callInfo,...)

{
  code *pcVar1;
  bool bVar2;
  int n;
  CallFlags CVar3;
  BOOL BVar4;
  PropertyId PVar5;
  ScriptContext *pSVar6;
  ThreadContext *this;
  Var *values;
  undefined4 *puVar7;
  JavascriptLibrary *pJVar8;
  Var pvVar9;
  CallInfo aValue;
  PropertyRecord *this_00;
  char16 *varName;
  RecyclableObject *pRVar10;
  Entry *local_160;
  Entry *local_150;
  Arguments local_110;
  int local_fc;
  undefined1 local_f8 [4];
  BOOL defineResult;
  PropertyDescriptor propertyDescriptor;
  PropertyRecord *propertyRecord;
  Var target;
  Var attributes;
  Var propertyKey;
  undefined1 local_90 [8];
  AutoTagNativeLibraryEntry __tag;
  Var undefinedValue;
  ScriptContext *scriptContext;
  ArgumentReader args;
  Var *_argsVarArray;
  RecyclableObject *function_local;
  CallInfo callInfo_local;
  TypeId local_18;
  TypeId typeId;
  
  function_local = (RecyclableObject *)callInfo;
  pSVar6 = RecyclableObject::GetScriptContext(function);
  this = ScriptContext::GetThreadContext(pSVar6);
  pSVar6 = RecyclableObject::GetScriptContext(function);
  ThreadContext::ProbeStack(this,0xc00,pSVar6,(PVOID)0x0);
  n = _count_args((CallInfo)function_local);
  values = _get_va(&stack0x00000000,n);
  args.super_Arguments.Values = (Type)function_local;
  bVar2 = CallInfo::operator==((CallInfo *)(values + -1),(CallInfo)function_local);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptReflect.cpp"
                                ,0xd,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  ArgumentReader::ArgumentReader
            ((ArgumentReader *)&scriptContext,(CallInfo *)&function_local,values);
  pSVar6 = RecyclableObject::GetScriptContext(function);
  pJVar8 = ScriptContext::GetLibrary(pSVar6);
  __tag.entry.next =
       (Entry *)JavascriptLibraryBase::GetUndefined(&pJVar8->super_JavascriptLibraryBase);
  AutoTagNativeLibraryEntry::AutoTagNativeLibraryEntry
            ((AutoTagNativeLibraryEntry *)local_90,function,(CallInfo)function_local,
             L"Reflect.defineProperty",&stack0x00000000);
  if (((uint)scriptContext & 0xffffff) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptReflect.cpp"
                                ,0x12,"(args.Info.Count > 0)","Should always have implicit \'this\'"
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  CVar3 = Js::operator&((uint)scriptContext >> 0x18,CallFlags_New);
  if (CVar3 == CallFlags_None) {
    if (1 < ((uint)scriptContext & 0xffffff)) {
      pvVar9 = Arguments::operator[]((Arguments *)&scriptContext,1);
      BVar4 = Js::JavascriptOperators::IsObject(pvVar9);
      if (BVar4 != 0) {
        aValue = (CallInfo)Arguments::operator[]((Arguments *)&scriptContext,1);
        if (((uint)scriptContext & 0xffffff) < 3) {
          local_150 = __tag.entry.next;
        }
        else {
          local_150 = (Entry *)Arguments::operator[]((Arguments *)&scriptContext,2);
        }
        JavascriptConversion::ToPropertyKey
                  (local_150,pSVar6,(PropertyRecord **)&propertyDescriptor.Configurable,
                   (PropertyString **)0x0);
        if (((uint)scriptContext & 0xffffff) < 4) {
          local_160 = __tag.entry.next;
        }
        else {
          local_160 = (Entry *)Arguments::operator[]((Arguments *)&scriptContext,3);
        }
        PropertyDescriptor::PropertyDescriptor((PropertyDescriptor *)local_f8);
        BVar4 = Js::JavascriptOperators::ToPropertyDescriptor
                          (local_160,(PropertyDescriptor *)local_f8,pSVar6);
        if (BVar4 != 0) {
          callInfo_local = aValue;
          if (aValue == (CallInfo)0x0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar7 = 1;
            bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                        ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar7 = 0;
          }
          bVar2 = TaggedInt::Is((Var)callInfo_local);
          if (bVar2) {
            local_18 = TypeIds_FirstNumberType;
          }
          else {
            bVar2 = JavascriptNumber::Is_NoTaggedIntCheck((Var)callInfo_local);
            if (bVar2) {
              local_18 = TypeIds_Number;
            }
            else {
              pRVar10 = UnsafeVarTo<Js::RecyclableObject>((Var)callInfo_local);
              if (pRVar10 == (RecyclableObject *)0x0) {
                AssertCount = AssertCount + 1;
                Throw::LogAssert();
                puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                *puVar7 = 1;
                bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                            ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
                if (!bVar2) {
                  pcVar1 = (code *)invalidInstructionException();
                  (*pcVar1)();
                }
                puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                *puVar7 = 0;
              }
              local_18 = RecyclableObject::GetTypeId(pRVar10);
              if ((0x57 < (int)local_18) &&
                 (BVar4 = RecyclableObject::IsExternal(pRVar10), BVar4 == 0)) {
                AssertCount = AssertCount + 1;
                Throw::LogAssert();
                puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                *puVar7 = 1;
                bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                            ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                            "GetTypeId aValue has invalid TypeId");
                if (!bVar2) {
                  pcVar1 = (code *)invalidInstructionException();
                  (*pcVar1)();
                }
                puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                *puVar7 = 0;
              }
            }
          }
          if (local_18 == TypeIds_HostDispatch) {
            pRVar10 = VarTo<Js::RecyclableObject>((Var)aValue);
            Arguments::Arguments(&local_110,(Arguments *)&scriptContext);
            local_fc = (*(pRVar10->super_FinalizableObject).super_IRecyclerVisitedObject.
                         _vptr_IRecyclerVisitedObject[0x55])
                                 (pRVar10,EntryDefineProperty,&local_110,0);
          }
          else {
            pRVar10 = VarTo<Js::RecyclableObject>((Var)aValue);
            PVar5 = PropertyRecord::GetPropertyId((PropertyRecord *)propertyDescriptor._40_8_);
            local_fc = JavascriptObject::DefineOwnPropertyHelper
                                 (pRVar10,PVar5,(PropertyDescriptor *)local_f8,pSVar6,false);
          }
          pJVar8 = ScriptContext::GetLibrary(pSVar6);
          pvVar9 = JavascriptLibrary::GetTrueOrFalse(pJVar8,local_fc);
          AutoTagNativeLibraryEntry::~AutoTagNativeLibraryEntry
                    ((AutoTagNativeLibraryEntry *)local_90);
          return pvVar9;
        }
        PVar5 = PropertyRecord::GetPropertyId((PropertyRecord *)propertyDescriptor._40_8_);
        this_00 = ScriptContext::GetPropertyName(pSVar6,PVar5);
        varName = PropertyRecord::GetBuffer(this_00);
        JavascriptError::ThrowTypeError(pSVar6,-0x7ff5ec2c,varName);
      }
    }
    JavascriptError::ThrowTypeError(pSVar6,-0x7ff5ec36,L"Reflect.defineProperty");
  }
  JavascriptError::ThrowTypeError(pSVar6,-0x7ff5ebf5,L"Reflect.defineProperty");
}

Assistant:

Var JavascriptReflect::EntryDefineProperty(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();
        Var undefinedValue = scriptContext->GetLibrary()->GetUndefined();
        AUTO_TAG_NATIVE_LIBRARY_ENTRY(function, callInfo, _u("Reflect.defineProperty"));

        AssertMsg(args.Info.Count > 0, "Should always have implicit 'this'");
        if  (args.Info.Flags & CallFlags_New)
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_ErrorOnNew, _u("Reflect.defineProperty"));
        }

        Var propertyKey, attributes;
        if (args.Info.Count < 2 || !JavascriptOperators::IsObject(args[1]))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NeedObject, _u("Reflect.defineProperty"));
        }
        Var target = args[1];

        propertyKey = args.Info.Count > 2 ? args[2] : undefinedValue;
        PropertyRecord const * propertyRecord;
        JavascriptConversion::ToPropertyKey(propertyKey, scriptContext, &propertyRecord, nullptr);

        attributes = args.Info.Count > 3 ? args[3] : undefinedValue;
        PropertyDescriptor propertyDescriptor;
        if (!JavascriptOperators::ToPropertyDescriptor(attributes, &propertyDescriptor, scriptContext))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_PropertyDescriptor_Invalid, scriptContext->GetPropertyName(propertyRecord->GetPropertyId())->GetBuffer());
        }

        // If the object is HostDispatch try to invoke the operation remotely
        BOOL defineResult;
        if (JavascriptOperators::GetTypeId(target) == TypeIds_HostDispatch)
        {
            defineResult = VarTo<RecyclableObject>(target)->InvokeBuiltInOperationRemotely(EntryDefineProperty, args, nullptr);
        }
        else
        {
            defineResult = JavascriptObject::DefineOwnPropertyHelper(VarTo<RecyclableObject>(target), propertyRecord->GetPropertyId(), propertyDescriptor, scriptContext, false);
        }

        return scriptContext->GetLibrary()->GetTrueOrFalse(defineResult);
    }